

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_complex_add(sexp ctx,sexp a,sexp b)

{
  sexp psVar1;
  sexp res;
  sexp imag;
  sexp real;
  sexp local_78;
  sexp local_70;
  sexp local_68;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_40.var = &local_78;
  local_78 = (sexp)0x43e;
  local_50.var = &local_68;
  local_68 = (sexp)0x43e;
  local_60.var = &local_70;
  local_70 = (sexp)0x43e;
  local_50.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  local_60.next = &local_50;
  (ctx->value).context.saves = &local_60;
  local_68 = sexp_add(ctx,(a->value).type.name,(b->value).type.name);
  local_70 = sexp_add(ctx,(a->value).type.cpl,(b->value).type.cpl);
  local_78 = sexp_make_complex(ctx,local_68,local_70);
  (ctx->value).context.saves = local_40.next;
  psVar1 = sexp_complex_normalize(local_78);
  return psVar1;
}

Assistant:

sexp sexp_complex_add (sexp ctx, sexp a, sexp b) {
  sexp_gc_var3(res, real, imag);
  sexp_gc_preserve3(ctx, res, real, imag);
  real = sexp_add(ctx, sexp_complex_real(a), sexp_complex_real(b));
  imag = sexp_add(ctx, sexp_complex_imag(a), sexp_complex_imag(b));
  res = sexp_make_complex(ctx, real, imag);
  sexp_gc_release3(ctx);
  return sexp_complex_normalize(res);
}